

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O2

aiMesh * __thiscall Assimp::Ogre::SubMesh::ConvertToAssimpMesh(SubMesh *this,Mesh *parent)

{
  uint uVar1;
  size_t __n;
  VertexData *this_00;
  element_type *peVar2;
  aiFace *paVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  aiMesh *this_01;
  VertexData **ppVVar6;
  VertexElement *pVVar7;
  VertexElement *this_02;
  VertexElement *this_03;
  VertexElement *this_04;
  ulong *puVar8;
  aiFace *paVar9;
  aiVector3D *paVar10;
  size_t sVar11;
  Logger *pLVar12;
  uint *puVar13;
  aiBone **ppaVar14;
  Bone *this_05;
  mapped_type *boneWeights;
  aiBone *paVar15;
  DeadlyImportError *pDVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  Bone *pBVar20;
  size_t ii;
  long lVar21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  MemoryStream *local_2d8;
  MemoryStream *local_2d0;
  aiVector3D *local_2c8;
  MemoryStream *local_2b0;
  uint16_t iout;
  undefined6 uStack_27e;
  _Rb_tree_node_base local_278;
  ulong local_258;
  SubMesh *local_250;
  long local_248;
  size_t local_240;
  ulong local_238;
  size_t local_230;
  ulong local_228;
  size_t local_220;
  ulong local_218;
  VertexElement *local_210;
  long local_208;
  MemoryStream *local_200;
  pointer local_1f8;
  pointer local_1f0;
  long local_1e8;
  ulong local_1e0;
  size_t local_1d8;
  ulong local_1d0;
  string local_1c8;
  AssimpVertexBoneWeightList weights;
  
  local_250 = this;
  if ((this->super_ISubMesh).operationType != OT_TRIANGLE_LIST) {
    pDVar16 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&weights);
    std::operator<<((ostream *)&weights,
                    "Only mesh operation type OT_TRIANGLE_LIST is supported. Found ");
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&weights,
               &(local_250->super_ISubMesh).operationType);
    std::__cxx11::stringbuf::str();
    DeadlyImportError::DeadlyImportError(pDVar16,(string *)&iout);
    __cxa_throw(pDVar16,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  this_01 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_01);
  this_01->mPrimitiveTypes = 4;
  __n = (this->super_ISubMesh).name._M_string_length;
  if (0xfffffffffffffc00 < __n - 0x400) {
    (this_01->mName).length = (ai_uint32)__n;
    memcpy((this_01->mName).data,(this->super_ISubMesh).name._M_dataplus._M_p,__n);
    (this_01->mName).data[__n] = '\0';
  }
  uVar1 = (this->super_ISubMesh).materialIndex;
  if (uVar1 != 0xffffffff) {
    this_01->mMaterialIndex = uVar1;
  }
  ppVVar6 = &this->vertexData;
  if ((this->super_ISubMesh).usesSharedVertexData != false) {
    ppVVar6 = &parent->sharedVertexData;
  }
  this_00 = *ppVVar6;
  pVVar7 = VertexData::GetVertexElement(this_00,VES_POSITION,0);
  this_02 = VertexData::GetVertexElement(this_00,VES_NORMAL,0);
  this_03 = VertexData::GetVertexElement(this_00,VES_TEXTURE_COORDINATES,0);
  this_04 = VertexData::GetVertexElement(this_00,VES_TEXTURE_COORDINATES,1);
  if (pVVar7 == (VertexElement *)0x0) {
    pDVar16 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&weights,
               "Failed to import Ogre VertexElement::VES_POSITION. Mesh does not have vertex positions!"
               ,(allocator<char> *)&iout);
    DeadlyImportError::DeadlyImportError(pDVar16,(string *)&weights);
    __cxa_throw(pDVar16,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (pVVar7->type != VET_FLOAT3) {
    pDVar16 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&weights,
               "Ogre Mesh position vertex element type != VertexElement::VET_FLOAT3. This is not supported."
               ,(allocator<char> *)&iout);
    DeadlyImportError::DeadlyImportError(pDVar16,(string *)&weights);
    __cxa_throw(pDVar16,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_210 = pVVar7;
  if ((this_02 != (VertexElement *)0x0) && (this_02->type != VET_FLOAT3)) {
    pDVar16 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&weights,
               "Ogre Mesh normal vertex element type != VertexElement::VET_FLOAT3. This is not supported."
               ,(allocator<char> *)&iout);
    DeadlyImportError::DeadlyImportError(pDVar16,(string *)&weights);
    __cxa_throw(pDVar16,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar1 = this->indexData->faceCount;
  uVar18 = (ulong)uVar1;
  this_01->mNumFaces = uVar1;
  puVar8 = (ulong *)operator_new__(uVar18 * 0x10 + 8);
  paVar3 = (aiFace *)(puVar8 + 1);
  *puVar8 = uVar18;
  if (uVar18 != 0) {
    paVar9 = paVar3;
    do {
      paVar9->mNumIndices = 0;
      paVar9->mIndices = (uint *)0x0;
      paVar9 = paVar9 + 1;
    } while (paVar9 != paVar3 + uVar18);
  }
  this_01->mFaces = paVar3;
  this_01->mNumVertices = uVar1 * 3;
  uVar17 = (ulong)(uVar1 * 3) * 0xc;
  paVar10 = (aiVector3D *)operator_new__(uVar17);
  if (uVar18 != 0) {
    uVar17 = uVar17 - 0xc;
    memset(paVar10,0,(uVar17 - uVar17 % 0xc) + 0xc);
  }
  pVVar7 = local_210;
  this_01->mVertices = paVar10;
  local_200 = VertexData::VertexBuffer(this_00,local_210->source);
  if (this_02 == (VertexElement *)0x0) {
    local_2b0 = (MemoryStream *)0x0;
  }
  else {
    local_2b0 = VertexData::VertexBuffer(this_00,this_02->source);
  }
  if (this_03 == (VertexElement *)0x0) {
    local_2d0 = (MemoryStream *)0x0;
  }
  else {
    local_2d0 = VertexData::VertexBuffer(this_00,this_03->source);
  }
  if (this_04 == (VertexElement *)0x0) {
    local_2d8 = (MemoryStream *)0x0;
  }
  else {
    local_2d8 = VertexData::VertexBuffer(this_00,this_04->source);
  }
  local_1d8 = VertexElement::Size(pVVar7);
  if (this_02 == (VertexElement *)0x0) {
    local_220 = 0;
  }
  else {
    local_220 = VertexElement::Size(this_02);
  }
  if (this_03 == (VertexElement *)0x0) {
    local_230 = 0;
  }
  else {
    local_230 = VertexElement::Size(this_03);
  }
  if (this_04 == (VertexElement *)0x0) {
    local_240 = 0;
  }
  else {
    local_240 = VertexElement::Size(this_04);
  }
  uVar4 = VertexData::VertexSize(this_00,pVVar7->source);
  if (this_02 == (VertexElement *)0x0) {
    local_218 = 0;
  }
  else {
    uVar5 = VertexData::VertexSize(this_00,this_02->source);
    local_218 = (ulong)uVar5;
  }
  if (this_03 == (VertexElement *)0x0) {
    local_228 = 0;
  }
  else {
    uVar5 = VertexData::VertexSize(this_00,this_03->source);
    local_228 = (ulong)uVar5;
  }
  if (this_04 == (VertexElement *)0x0) {
    local_238 = 0;
  }
  else {
    uVar5 = VertexData::VertexSize(this_00,this_04->source);
    local_238 = (ulong)uVar5;
  }
  local_1f0 = (this_00->super_IVertexData).boneAssignments.
              super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_1f8 = (this_00->super_IVertexData).boneAssignments.
              super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_2b0 != (MemoryStream *)0x0) {
    uVar1 = this_01->mNumVertices;
    uVar18 = (ulong)uVar1 * 0xc;
    paVar10 = (aiVector3D *)operator_new__(uVar18);
    if ((ulong)uVar1 != 0) {
      uVar18 = uVar18 - 0xc;
      memset(paVar10,0,(uVar18 - uVar18 % 0xc) + 0xc);
    }
    this_01->mNormals = paVar10;
  }
  if (local_2d0 == (MemoryStream *)0x0) {
    local_2d0 = (MemoryStream *)0x0;
  }
  else if (this_03->type - VET_FLOAT2 < 2) {
    sVar11 = VertexElement::ComponentCount(this_03);
    this_01->mNumUVComponents[0] = (uint)sVar11;
    uVar1 = this_01->mNumVertices;
    uVar18 = (ulong)uVar1 * 0xc;
    paVar10 = (aiVector3D *)operator_new__(uVar18);
    if ((ulong)uVar1 != 0) {
      uVar18 = uVar18 - 0xc;
      memset(paVar10,0,(uVar18 - uVar18 % 0xc) + 0xc);
    }
    this_01->mTextureCoords[0] = paVar10;
  }
  else {
    pLVar12 = DefaultLogger::get();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&weights);
    std::operator<<((ostream *)&weights,"Ogre imported UV0 type ");
    VertexElement::TypeToString_abi_cxx11_(&local_1c8,this_03);
    std::operator<<((ostream *)&weights,(string *)&local_1c8);
    std::operator<<((ostream *)&weights," is not compatible with Assimp. Ignoring UV.");
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar12,(char *)CONCAT62(uStack_27e,iout));
    std::__cxx11::string::~string((string *)&iout);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&weights);
    local_2d0 = (MemoryStream *)0x0;
  }
  if (local_2d8 != (MemoryStream *)0x0) {
    if (this_04->type - VET_FLOAT2 < 2) {
      sVar11 = VertexElement::ComponentCount(this_04);
      this_01->mNumUVComponents[1] = (uint)sVar11;
      uVar1 = this_01->mNumVertices;
      uVar18 = (ulong)uVar1 * 0xc;
      paVar10 = (aiVector3D *)operator_new__(uVar18);
      if ((ulong)uVar1 != 0) {
        uVar18 = uVar18 - 0xc;
        memset(paVar10,0,(uVar18 - uVar18 % 0xc) + 0xc);
      }
      this_01->mTextureCoords[1] = paVar10;
      goto LAB_003dfb48;
    }
    pLVar12 = DefaultLogger::get();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&weights);
    std::operator<<((ostream *)&weights,"Ogre imported UV0 type ");
    VertexElement::TypeToString_abi_cxx11_(&local_1c8,this_04);
    std::operator<<((ostream *)&weights,(string *)&local_1c8);
    std::operator<<((ostream *)&weights," is not compatible with Assimp. Ignoring UV.");
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar12,(char *)CONCAT62(uStack_27e,iout));
    std::__cxx11::string::~string((string *)&iout);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&weights);
  }
  local_2d8 = (MemoryStream *)0x0;
LAB_003dfb48:
  if (local_2d0 == (MemoryStream *)0x0) {
    local_2c8 = (aiVector3D *)0x0;
  }
  else {
    local_2c8 = this_01->mTextureCoords[0];
  }
  local_1d0 = (ulong)uVar4;
  if (local_2d8 == (MemoryStream *)0x0) {
    paVar10 = (aiVector3D *)0x0;
  }
  else {
    paVar10 = this_01->mTextureCoords[1];
  }
  peVar2 = (this->indexData->buffer).
           super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  bVar23 = this->indexData->is32bit;
  local_248 = (ulong)bVar23 * 2 + 2;
  local_1e8 = 6;
  if (bVar23 != false) {
    local_1e8 = 0xc;
  }
  bVar23 = local_2c8 != (aiVector3D *)0x0;
  bVar24 = paVar10 != (aiVector3D *)0x0;
  lVar22 = 0;
  local_208 = 0;
  uVar18 = 0;
  while (uVar18 < this_01->mNumFaces) {
    weights._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    weights._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    weights._M_t._M_impl._0_4_ = 3;
    weights._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = operator_new__(0xc);
    (*(peVar2->super_IOStream)._vptr_IOStream[4])(peVar2,uVar18 * local_1e8,0);
    lVar19 = local_248;
    if (this->indexData->is32bit == true) {
      (*(peVar2->super_IOStream)._vptr_IOStream[2])
                (peVar2,weights._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,local_248,3);
    }
    else {
      iout = 0;
      for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
        (*(peVar2->super_IOStream)._vptr_IOStream[2])(peVar2,&iout,lVar19,1);
        *(uint *)(weights._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + lVar21 * 4) =
             (uint)iout;
      }
    }
    paVar3 = this_01->mFaces;
    paVar3[uVar18].mNumIndices = 3;
    local_1e0 = uVar18;
    puVar13 = (uint *)operator_new__(0xc);
    paVar3[uVar18].mIndices = puVar13;
    lVar21 = 0;
    for (lVar19 = 0; lVar19 != 0x24; lVar19 = lVar19 + 0xc) {
      uVar4 = (int)local_208 + (int)lVar21;
      paVar3[uVar18].mIndices[lVar21] = uVar4;
      uVar1 = *(uint *)(weights._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + lVar21 * 4);
      uVar17 = (ulong)uVar1;
      IVertexData::AddVertexMapping(&this_00->super_IVertexData,uVar1,uVar4);
      (*(local_200->super_IOStream)._vptr_IOStream[4])
                (local_200,(ulong)local_210->offset + uVar17 * local_1d0,0);
      (*(local_200->super_IOStream)._vptr_IOStream[2])
                (local_200,(long)&this_01->mVertices->x + lVar19 + lVar22,local_1d8,1);
      if (local_2b0 != (MemoryStream *)0x0) {
        (*(local_2b0->super_IOStream)._vptr_IOStream[4])
                  (local_2b0,(ulong)this_02->offset + local_218 * uVar17,0);
        (*(local_2b0->super_IOStream)._vptr_IOStream[2])
                  (local_2b0,(long)&this_01->mNormals->x + lVar19 + lVar22,local_220,1);
      }
      if (bVar23 && local_2d0 != (MemoryStream *)0x0) {
        (*(local_2d0->super_IOStream)._vptr_IOStream[4])
                  (local_2d0,(ulong)this_03->offset + local_228 * uVar17,0);
        (*(local_2d0->super_IOStream)._vptr_IOStream[2])
                  (local_2d0,(long)&local_2c8->x + lVar19,local_230,1);
        *(float *)((long)&local_2c8->y + lVar19) = 1.0 - *(float *)((long)&local_2c8->y + lVar19);
      }
      if (bVar24 && local_2d8 != (MemoryStream *)0x0) {
        (*(local_2d8->super_IOStream)._vptr_IOStream[4])
                  (local_2d8,(ulong)this_04->offset + uVar17 * local_238,0);
        (*(local_2d8->super_IOStream)._vptr_IOStream[2])
                  (local_2d8,(long)&paVar10->x + lVar19,local_240,1);
        *(float *)((long)&paVar10->y + lVar19) = 1.0 - *(float *)((long)&paVar10->y + lVar19);
      }
      lVar21 = lVar21 + 1;
    }
    aiFace::~aiFace((aiFace *)&weights);
    local_208 = local_208 + 3;
    lVar22 = lVar22 + 0x24;
    local_2c8 = local_2c8 + 3;
    paVar10 = paVar10 + 3;
    this = local_250;
    uVar18 = local_1e0 + 1;
  }
  if ((local_1f0 != local_1f8) && (parent->skeleton != (Skeleton *)0x0)) {
    IVertexData::AssimpBoneWeights
              (&weights,&this_00->super_IVertexData,(ulong)this_01->mNumVertices);
    IVertexData::ReferencedBonesByWeights
              ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)
               &iout,&this_00->super_IVertexData);
    this_01->mNumBones = (uint)local_258;
    ppaVar14 = (aiBone **)operator_new__((local_258 & 0xffffffff) << 3);
    this_01->mBones = ppaVar14;
    lVar22 = 0;
    while (local_278._M_left != &local_278) {
      this_05 = Skeleton::BoneById(parent->skeleton,(short)local_278._M_left[1]._M_color);
      pBVar20 = this_05;
      boneWeights = std::
                    map<unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                    ::operator[](&weights,&this_05->id);
      paVar15 = Bone::ConvertToAssimpBone(this_05,(Skeleton *)pBVar20,boneWeights);
      *(aiBone **)((long)this_01->mBones + lVar22) = paVar15;
      local_278._M_left = (_Base_ptr)std::_Rb_tree_increment(local_278._M_left);
      lVar22 = lVar22 + 8;
    }
    std::
    _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
    ::~_Rb_tree((_Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
                 *)&iout);
    std::
    _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
    ::~_Rb_tree(&weights._M_t);
  }
  return this_01;
}

Assistant:

aiMesh *SubMesh::ConvertToAssimpMesh(Mesh *parent)
{
    if (operationType != OT_TRIANGLE_LIST) {
        throw DeadlyImportError(Formatter::format() << "Only mesh operation type OT_TRIANGLE_LIST is supported. Found " << operationType);
    }

    aiMesh *dest = new aiMesh();
    dest->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

    if (!name.empty())
        dest->mName = name;

    // Material index
    if (materialIndex != -1)
        dest->mMaterialIndex = materialIndex;

    // Pick source vertex data from shader geometry or from internal geometry.
    VertexData *src = (!usesSharedVertexData ? vertexData : parent->sharedVertexData);

    VertexElement *positionsElement = src->GetVertexElement(VertexElement::VES_POSITION);
    VertexElement *normalsElement   = src->GetVertexElement(VertexElement::VES_NORMAL);
    VertexElement *uv1Element       = src->GetVertexElement(VertexElement::VES_TEXTURE_COORDINATES, 0);
    VertexElement *uv2Element       = src->GetVertexElement(VertexElement::VES_TEXTURE_COORDINATES, 1);

    // Sanity checks
    if (!positionsElement) {
        throw DeadlyImportError("Failed to import Ogre VertexElement::VES_POSITION. Mesh does not have vertex positions!");
    } else if (positionsElement->type != VertexElement::VET_FLOAT3) {
        throw DeadlyImportError("Ogre Mesh position vertex element type != VertexElement::VET_FLOAT3. This is not supported.");
    } else if (normalsElement && normalsElement->type != VertexElement::VET_FLOAT3) {
        throw DeadlyImportError("Ogre Mesh normal vertex element type != VertexElement::VET_FLOAT3. This is not supported.");
    }

    // Faces
    dest->mNumFaces = indexData->faceCount;
    dest->mFaces = new aiFace[dest->mNumFaces];

    // Assimp required unique vertices, we need to convert from Ogres shared indexing.
    size_t uniqueVertexCount = dest->mNumFaces * 3;
    dest->mNumVertices = static_cast<unsigned int>(uniqueVertexCount);
    dest->mVertices = new aiVector3D[dest->mNumVertices];

    // Source streams
    MemoryStream *positions      = src->VertexBuffer(positionsElement->source);
    MemoryStream *normals        = (normalsElement ? src->VertexBuffer(normalsElement->source) : 0);
    MemoryStream *uv1            = (uv1Element ? src->VertexBuffer(uv1Element->source) : 0);
    MemoryStream *uv2            = (uv2Element ? src->VertexBuffer(uv2Element->source) : 0);

    // Element size
    const size_t sizePosition    = positionsElement->Size();
    const size_t sizeNormal      = (normalsElement ? normalsElement->Size() : 0);
    const size_t sizeUv1         = (uv1Element ? uv1Element->Size() : 0);
    const size_t sizeUv2         = (uv2Element ? uv2Element->Size() : 0);

    // Vertex width
    const size_t vWidthPosition  = src->VertexSize(positionsElement->source);
    const size_t vWidthNormal    = (normalsElement ? src->VertexSize(normalsElement->source) : 0);
    const size_t vWidthUv1       = (uv1Element ? src->VertexSize(uv1Element->source) : 0);
    const size_t vWidthUv2       = (uv2Element ? src->VertexSize(uv2Element->source) : 0);

    bool boneAssignments = src->HasBoneAssignments();

    // Prepare normals
    if (normals)
        dest->mNormals = new aiVector3D[dest->mNumVertices];

    // Prepare UVs, ignoring incompatible UVs.
    if (uv1)
    {
        if (uv1Element->type == VertexElement::VET_FLOAT2 || uv1Element->type == VertexElement::VET_FLOAT3)
        {
            dest->mNumUVComponents[0] = static_cast<unsigned int>(uv1Element->ComponentCount());
            dest->mTextureCoords[0] = new aiVector3D[dest->mNumVertices];
        }
        else
        {
            ASSIMP_LOG_WARN(Formatter::format() << "Ogre imported UV0 type " << uv1Element->TypeToString() << " is not compatible with Assimp. Ignoring UV.");
            uv1 = 0;
        }
    }
    if (uv2)
    {
        if (uv2Element->type == VertexElement::VET_FLOAT2 || uv2Element->type == VertexElement::VET_FLOAT3)
        {
            dest->mNumUVComponents[1] = static_cast<unsigned int>(uv2Element->ComponentCount());
            dest->mTextureCoords[1] = new aiVector3D[dest->mNumVertices];
        }
        else
        {
            ASSIMP_LOG_WARN(Formatter::format() << "Ogre imported UV0 type " << uv2Element->TypeToString() << " is not compatible with Assimp. Ignoring UV.");
            uv2 = 0;
        }
    }

    aiVector3D *uv1Dest = (uv1 ? dest->mTextureCoords[0] : 0);
    aiVector3D *uv2Dest = (uv2 ? dest->mTextureCoords[1] : 0);

    MemoryStream *faces = indexData->buffer.get();
    for (size_t fi=0, isize=indexData->IndexSize(), fsize=indexData->FaceSize();
         fi<dest->mNumFaces; ++fi)
    {
        // Source Ogre face
        aiFace ogreFace;
        ogreFace.mNumIndices = 3;
        ogreFace.mIndices = new unsigned int[3];

        faces->Seek(fi * fsize, aiOrigin_SET);
        if (indexData->is32bit)
        {
            faces->Read(&ogreFace.mIndices[0], isize, 3);
        }
        else
        {
            uint16_t iout = 0;
            for (size_t ii=0; ii<3; ++ii)
            {
                faces->Read(&iout, isize, 1);
                ogreFace.mIndices[ii] = static_cast<unsigned int>(iout);
            }
        }

        // Destination Assimp face
        aiFace &face = dest->mFaces[fi];
        face.mNumIndices = 3;
        face.mIndices = new unsigned int[3];

        const size_t pos = fi * 3;
        for (size_t v=0; v<3; ++v)
        {
            const size_t newIndex = pos + v;

            // Write face index
            face.mIndices[v] = static_cast<unsigned int>(newIndex);

            // Ogres vertex index to ref into the source buffers.
            const size_t ogreVertexIndex = ogreFace.mIndices[v];
            src->AddVertexMapping(static_cast<uint32_t>(ogreVertexIndex), static_cast<uint32_t>(newIndex));

            // Position
            positions->Seek((vWidthPosition * ogreVertexIndex) + positionsElement->offset, aiOrigin_SET);
            positions->Read(&dest->mVertices[newIndex], sizePosition, 1);

            // Normal
            if (normals)
            {
                normals->Seek((vWidthNormal * ogreVertexIndex) + normalsElement->offset, aiOrigin_SET);
                normals->Read(&dest->mNormals[newIndex], sizeNormal, 1);
            }
            // UV0
            if (uv1 && uv1Dest)
            {
                uv1->Seek((vWidthUv1 * ogreVertexIndex) + uv1Element->offset, aiOrigin_SET);
                uv1->Read(&uv1Dest[newIndex], sizeUv1, 1);
                uv1Dest[newIndex].y = (uv1Dest[newIndex].y * -1) + 1; // Flip UV from Ogre to Assimp form
            }
            // UV1
            if (uv2 && uv2Dest)
            {
                uv2->Seek((vWidthUv2 * ogreVertexIndex) + uv2Element->offset, aiOrigin_SET);
                uv2->Read(&uv2Dest[newIndex], sizeUv2, 1);
                uv2Dest[newIndex].y = (uv2Dest[newIndex].y * -1) + 1; // Flip UV from Ogre to Assimp form
            }
        }
    }

    // Bones and bone weights
    if (parent->skeleton && boneAssignments)
    {
        AssimpVertexBoneWeightList weights = src->AssimpBoneWeights(dest->mNumVertices);
        std::set<uint16_t> referencedBones = src->ReferencedBonesByWeights();

        dest->mNumBones = static_cast<unsigned int>(referencedBones.size());
        dest->mBones = new aiBone*[dest->mNumBones];

        size_t assimpBoneIndex = 0;
        for(std::set<uint16_t>::const_iterator rbIter=referencedBones.begin(), rbEnd=referencedBones.end(); rbIter != rbEnd; ++rbIter, ++assimpBoneIndex)
        {
            Bone *bone = parent->skeleton->BoneById((*rbIter));
            dest->mBones[assimpBoneIndex] = bone->ConvertToAssimpBone(parent->skeleton, weights[bone->id]);
        }
    }

    return dest;
}